

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

M44d * Imath_2_5::procrustesRotationAndTranslation<float>
                 (M44d *__return_storage_ptr__,Vec3<float> *A,Vec3<float> *B,float *weights,
                 size_t numPoints,bool doScale)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  size_t sVar13;
  long lVar14;
  double *pdVar15;
  double (*V_00) [3];
  long lVar16;
  int k;
  double (*A_00) [3];
  float *pfVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar30;
  undefined1 auVar29 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  M33d Qt;
  M33d C;
  V3d S;
  M33d V;
  M33d U;
  double local_1f8 [10];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  double local_168;
  double local_158;
  double dStack_150;
  undefined1 local_148 [24];
  Vec3<double> local_130;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  Matrix33<double> local_c8;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 0.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 0.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar29 = ZEXT816(0);
    if (weights == (float *)0x0) {
      lVar11 = 8;
      auVar34 = ZEXT816(0);
      auVar33 = ZEXT816(0);
      sVar13 = numPoints;
      do {
        uVar1 = *(undefined8 *)((long)A + lVar11 + -8);
        dVar26 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + (double)(float)uVar1;
        auVar34._8_8_ = dVar26 + (double)(float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)B + lVar11 + -8);
        dVar26 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + (double)(float)uVar1;
        auVar29._8_8_ = dVar26 + (double)(float)((ulong)uVar1 >> 0x20);
        dVar26 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + (double)*(float *)((long)&B->x + lVar11);
        auVar33._8_8_ = dVar26 + (double)*(float *)((long)&A->x + lVar11);
        lVar11 = lVar11 + 0xc;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
      auVar21._8_4_ = (int)(numPoints >> 0x20);
      auVar21._0_8_ = numPoints;
      auVar21._12_4_ = 0x45300000;
      dVar26 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar26 = 0.0;
      lVar11 = 2;
      sVar13 = 0;
      auVar34 = ZEXT816(0);
      auVar33 = ZEXT816(0);
      do {
        dVar20 = (double)weights[sVar13];
        dVar26 = dVar26 + dVar20;
        uVar1 = *(undefined8 *)((long)A + lVar11 * 4 + -8);
        dVar30 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + (double)(float)uVar1 * dVar20;
        auVar34._8_8_ = dVar30 + (double)(float)((ulong)uVar1 >> 0x20) * dVar20;
        uVar1 = *(undefined8 *)((long)B + lVar11 * 4 + -8);
        dVar30 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + (double)(float)uVar1 * dVar20;
        auVar29._8_8_ = dVar30 + (double)(float)((ulong)uVar1 >> 0x20) * dVar20;
        dVar30 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + (double)(&B->x)[lVar11] * dVar20;
        auVar33._8_8_ = dVar30 + (double)(&A->x)[lVar11] * dVar20;
        sVar13 = sVar13 + 1;
        lVar11 = lVar11 + 3;
      } while (numPoints != sVar13);
    }
    uVar19 = (undefined4)((ulong)dVar26 >> 0x20);
    uVar18 = SUB84(dVar26,0);
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      lVar11 = numPoints + (numPoints == 0);
      auVar2._8_4_ = uVar18;
      auVar2._0_8_ = dVar26;
      auVar2._12_4_ = uVar19;
      local_148._0_16_ = divpd(auVar34,auVar2);
      auVar3._8_4_ = uVar18;
      auVar3._0_8_ = dVar26;
      auVar3._12_4_ = uVar19;
      auVar29 = divpd(auVar29,auVar3);
      auVar4._8_4_ = uVar18;
      auVar4._0_8_ = dVar26;
      auVar4._12_4_ = uVar19;
      auVar33 = divpd(auVar33,auVar4);
      dVar26 = 0.0;
      dVar20 = 0.0;
      local_198._0_8_ = 0.0;
      local_198._8_8_ = 0.0;
      local_188._0_8_ = 0.0;
      local_188._8_8_ = 0.0;
      local_178._0_8_ = 0.0;
      local_178._8_8_ = 0.0;
      local_168 = 0.0;
      local_158 = auVar33._8_8_;
      dVar32 = auVar33._0_8_;
      dVar30 = auVar29._0_8_;
      dVar31 = auVar29._8_8_;
      if (weights == (float *)0x0) {
        lVar14 = 8;
        dVar26 = 0.0;
        dVar20 = 0.0;
        do {
          uVar1 = *(undefined8 *)((long)A + lVar14 + -8);
          dVar23 = (double)*(float *)((long)&B->x + lVar14) - dVar32;
          dVar22 = (double)*(float *)((long)&A->x + lVar14) - local_158;
          dVar24 = (double)(float)uVar1 - local_148._0_8_;
          dVar25 = (double)(float)((ulong)uVar1 >> 0x20) - local_148._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar14 + -8);
          dVar27 = (double)(float)uVar1 - dVar30;
          dVar28 = (double)(float)((ulong)uVar1 >> 0x20) - dVar31;
          dVar26 = dVar26 + dVar27 * dVar24;
          dVar20 = dVar20 + dVar27 * dVar25;
          local_198._0_8_ = (double)local_198._0_8_ + dVar22 * dVar27;
          local_198._8_8_ = (double)local_198._8_8_ + dVar24 * dVar28;
          local_188._0_8_ = (double)local_188._0_8_ + dVar25 * dVar28;
          local_188._8_8_ = (double)local_188._8_8_ + dVar22 * dVar28;
          local_178._0_8_ = (double)local_178._0_8_ + dVar23 * dVar24;
          local_178._8_8_ = (double)local_178._8_8_ + dVar23 * dVar25;
          local_168 = local_168 + dVar22 * dVar23;
          lVar14 = lVar14 + 0xc;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      else {
        lVar14 = 2;
        lVar16 = 0;
        do {
          dVar24 = (double)weights[lVar16];
          dVar22 = ((double)(&B->x)[lVar14] - dVar32) * dVar24;
          dVar23 = (double)(&A->x)[lVar14] - local_158;
          uVar1 = *(undefined8 *)((long)A + lVar14 * 4 + -8);
          dVar27 = (double)(float)uVar1 - local_148._0_8_;
          dVar28 = (double)(float)((ulong)uVar1 >> 0x20) - local_148._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar14 * 4 + -8);
          dVar25 = dVar24 * ((double)(float)uVar1 - dVar30);
          dVar24 = dVar24 * ((double)(float)((ulong)uVar1 >> 0x20) - dVar31);
          dVar26 = dVar26 + dVar25 * dVar27;
          dVar20 = dVar20 + dVar25 * dVar28;
          local_198._0_8_ = (double)local_198._0_8_ + dVar23 * dVar25;
          local_198._8_8_ = (double)local_198._8_8_ + dVar27 * dVar24;
          local_188._0_8_ = (double)local_188._0_8_ + dVar28 * dVar24;
          local_188._8_8_ = (double)local_188._8_8_ + dVar23 * dVar24;
          local_178._0_8_ = (double)local_178._0_8_ + dVar22 * dVar27;
          local_178._8_8_ = (double)local_178._8_8_ + dVar22 * dVar28;
          local_168 = local_168 + dVar23 * dVar22;
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 3;
        } while (lVar11 != lVar16);
      }
      uVar10 = (ulong)local_178._8_8_ >> 0x20;
      uVar9 = (ulong)local_188._8_8_ >> 0x20;
      uVar8 = (ulong)local_198._8_8_ >> 0x20;
      A_00 = (double (*) [3])local_1a8;
      local_1a8._8_4_ = SUB84(dVar20,0);
      local_1a8._0_8_ = dVar26;
      local_1a8._12_4_ = (int)((ulong)dVar20 >> 0x20);
      local_198._8_4_ = (int)local_198._8_8_;
      local_198._12_4_ = (int)uVar8;
      local_188._8_4_ = (int)local_188._8_8_;
      local_188._12_4_ = (int)uVar9;
      local_178._8_4_ = (int)local_178._8_8_;
      local_178._12_4_ = (int)uVar10;
      local_c8.x[0][1] = 0.0;
      local_c8.x[1][2] = 0.0;
      local_c8.x[2][0] = 0.0;
      local_c8.x[2][1] = 0.0;
      local_c8.x[0][2] = 0.0;
      local_c8.x[1][0] = 0.0;
      local_c8.x[0][0] = 1.0;
      local_c8.x[1][1] = 1.0;
      local_c8.x[2][2] = 1.0;
      V_00 = (double (*) [3])&local_118;
      dStack_110 = 0.0;
      uStack_f0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_108 = 0.0;
      uStack_100 = 0;
      local_118 = 1.0;
      local_f8 = 0x3ff0000000000000;
      local_d8 = 0x3ff0000000000000;
      dStack_150 = local_158;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_c8,&local_130,(Matrix33<double> *)V_00,
                        2.220446049250313e-16,true);
      local_78 = local_c8.x[0][0];
      local_70 = local_c8.x[1][0];
      local_68 = local_c8.x[2][0];
      local_60 = local_c8.x[0][1];
      local_58 = local_c8.x[1][1];
      local_50 = local_c8.x[2][1];
      local_48 = local_c8.x[0][2];
      local_40 = local_c8.x[1][2];
      local_38 = local_c8.x[2][2];
      local_1f8[6] = 0.0;
      local_1f8[7] = 0.0;
      local_1f8[4] = 0.0;
      local_1f8[5] = 0.0;
      local_1f8[2] = 0.0;
      local_1f8[3] = 0.0;
      local_1f8[0] = 0.0;
      local_1f8[1] = 0.0;
      local_1f8[8] = 0.0;
      lVar11 = 0;
      do {
        lVar14 = 0;
        pdVar12 = &local_78;
        do {
          dVar26 = local_1f8[lVar11 * 3 + lVar14];
          lVar16 = 0;
          pdVar15 = pdVar12;
          do {
            dVar26 = dVar26 + (*(double (*) [3])*V_00)[lVar16] * *pdVar15;
            lVar16 = lVar16 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar16 != 3);
          local_1f8[lVar11 * 3 + lVar14] = dVar26;
          lVar14 = lVar14 + 1;
          pdVar12 = pdVar12 + 1;
        } while (lVar14 != 3);
        lVar11 = lVar11 + 1;
        V_00 = V_00 + 1;
      } while (lVar11 != 3);
      if (doScale && numPoints != 1) {
        lVar11 = numPoints + (numPoints == 0);
        if (weights == (float *)0x0) {
          pfVar17 = &A->z;
          dVar26 = 0.0;
          dVar20 = 0.0;
          do {
            dVar23 = (double)((Vec3<float> *)(pfVar17 + -2))->x - (double)local_148._0_8_;
            dVar26 = (((double)*pfVar17 - local_158) * ((double)*pfVar17 - local_158) +
                     dVar23 * dVar23 +
                     ((double)pfVar17[-1] - (double)local_148._8_8_) *
                     ((double)pfVar17[-1] - (double)local_148._8_8_)) - dVar26;
            dVar23 = dVar20 + dVar26;
            dVar26 = (dVar23 - dVar20) - dVar26;
            pfVar17 = pfVar17 + 3;
            lVar11 = lVar11 + -1;
            dVar20 = dVar23;
          } while (lVar11 != 0);
        }
        else {
          pfVar17 = &A->z;
          lVar14 = 0;
          dVar26 = 0.0;
          dVar20 = 0.0;
          do {
            dVar23 = (double)((Vec3<float> *)(pfVar17 + -2))->x - (double)local_148._0_8_;
            dVar26 = (((double)*pfVar17 - local_158) * ((double)*pfVar17 - local_158) +
                     dVar23 * dVar23 +
                     ((double)pfVar17[-1] - (double)local_148._8_8_) *
                     ((double)pfVar17[-1] - (double)local_148._8_8_)) * (double)weights[lVar14] -
                     dVar26;
            dVar23 = dVar20 + dVar26;
            dVar26 = (dVar23 - dVar20) - dVar26;
            lVar14 = lVar14 + 1;
            pfVar17 = pfVar17 + 3;
            dVar20 = dVar23;
          } while (lVar11 != lVar14);
        }
        dVar26 = 0.0;
        pdVar12 = local_1f8;
        lVar11 = 0;
        dVar20 = 0.0;
        do {
          lVar14 = 0;
          pdVar15 = pdVar12;
          dVar22 = dVar26;
          do {
            dVar20 = *pdVar15 * (*(double (*) [3])*A_00)[lVar14] - dVar20;
            dVar26 = dVar22 + dVar20;
            dVar20 = (dVar26 - dVar22) - dVar20;
            lVar14 = lVar14 + 1;
            pdVar15 = pdVar15 + 3;
            dVar22 = dVar26;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          A_00 = A_00 + 1;
          pdVar12 = pdVar12 + 1;
        } while (lVar11 != 3);
        dVar26 = dVar26 / dVar23;
      }
      else {
        dVar26 = 1.0;
      }
      dVar23 = (double)local_148._0_8_ * dVar26;
      dVar20 = (double)local_148._8_8_ * dVar26;
      local_158 = local_158 * dVar26;
      auVar6._8_4_ = SUB84(dVar26 * local_1f8[1],0);
      auVar6._0_8_ = dVar26 * local_1f8[0];
      auVar6._12_4_ = (int)((ulong)(dVar26 * local_1f8[1]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[0] = auVar6;
      __return_storage_ptr__->x[0][2] = local_1f8[2] * dVar26;
      __return_storage_ptr__->x[0][3] = 0.0;
      auVar7._8_4_ = SUB84(dVar26 * local_1f8[4],0);
      auVar7._0_8_ = dVar26 * local_1f8[3];
      auVar7._12_4_ = (int)((ulong)(dVar26 * local_1f8[4]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[1] = auVar7;
      __return_storage_ptr__->x[1][2] = local_1f8[5] * dVar26;
      __return_storage_ptr__->x[1][3] = 0.0;
      auVar5._8_4_ = SUB84(dVar26 * local_1f8[7],0);
      auVar5._0_8_ = dVar26 * local_1f8[6];
      auVar5._12_4_ = (int)((ulong)(dVar26 * local_1f8[7]) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[2] = auVar5;
      __return_storage_ptr__->x[2][2] = local_1f8[8] * dVar26;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           dVar30 - (local_158 * local_1f8[6] + dVar23 * local_1f8[0] + dVar20 * local_1f8[3]);
      __return_storage_ptr__->x[3][1] =
           dVar31 - (local_158 * local_1f8[7] + dVar23 * local_1f8[1] + dVar20 * local_1f8[4]);
      __return_storage_ptr__->x[3][2] =
           dVar32 - (local_158 * local_1f8[8] + dVar23 * local_1f8[2] + dVar20 * local_1f8[5]);
    }
    else {
      __return_storage_ptr__->x[0][0] = 0.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 0.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
      __return_storage_ptr__->x[3][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (const Vec3<T>* A, const Vec3<T>* B, const T* weights, const size_t numPoints, const bool doScale)
{
    if (numPoints == 0)
        return M44d();

    // Always do the accumulation in double precision:
    V3d Acenter (0.0);
    V3d Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0)
        return M44d();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C += outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d S;
    jacobiSVD (C, U, S, V, IMATH_INTERNAL_NAMESPACE::limits<double>::epsilon(), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).  
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.  
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((double) weights[i]) * ((V3d) A[i] - Acenter).length2();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get() / traceATA.get();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).  
    const V3d translate = Bcenter - s*Acenter*Qt;

    return M44d (s*Qt.x[0][0], s*Qt.x[0][1], s*Qt.x[0][2], T(0),
                 s*Qt.x[1][0], s*Qt.x[1][1], s*Qt.x[1][2], T(0),
                 s*Qt.x[2][0], s*Qt.x[2][1], s*Qt.x[2][2], T(0),
                 translate.x, translate.y, translate.z, T(1));
}